

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O3

void test_memory_leaks(char *dir,int key_gt_1K,vmemcache_repl_p repl_p,uint seed)

{
  int iVar1;
  VMEMcache *pVVar2;
  size_t sVar3;
  VMEMcache *cache;
  void *pvVar4;
  int *piVar5;
  undefined8 extraout_RAX;
  void *__dest;
  undefined8 uVar6;
  ulong extraout_RDX;
  long unaff_RBX;
  VMEMcache *pVVar7;
  uint uVar8;
  undefined4 uVar9;
  stat_t *__s;
  stat_t sVar10;
  undefined *puVar11;
  void *__src;
  void *pvVar12;
  char *unaff_R12;
  size_t unaff_R13;
  long lVar13;
  stat_t *psVar14;
  stat_t *get;
  char *pcVar15;
  ulong __n;
  undefined **ppuVar16;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined8 uStack_740;
  undefined1 auStack_738 [64];
  undefined1 auStack_6f8 [32];
  undefined1 auStack_6d8 [16];
  undefined1 *apuStack_6c8 [2];
  long alStack_6b8 [2];
  undefined1 *puStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined1 *puStack_688;
  undefined8 uStack_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined1 *puStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined1 *puStack_648;
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined1 *puStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined1 *puStack_608;
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 *puStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined1 *puStack_5c8;
  undefined8 uStack_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined1 *puStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined1 *puStack_588;
  undefined8 uStack_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined1 *puStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined1 *puStack_548;
  undefined8 uStack_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined1 *puStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 *puStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 *puStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  long lStack_4c8;
  VMEMcache *pVStack_4c0;
  char *pcStack_4b8;
  size_t sStack_4b0;
  char *pcStack_4a8;
  VMEMcache *pVStack_4a0;
  code *pcStack_498;
  long lStack_490;
  char *pcStack_488;
  stat_t *psStack_480;
  VMEMcache *pVStack_478;
  code *pcStack_470;
  size_t *in_stack_fffffffffffffb98;
  stat_t in_stack_fffffffffffffba0;
  big_key bk;
  size_t local_50;
  size_t vsize;
  ulong local_40;
  stat_t n_evicts;
  stat_t n_puts;
  
  pcStack_470 = (code *)0x105fe7;
  vsize._4_4_ = key_gt_1K;
  srand(repl_p);
  n_evicts = 0;
  local_40 = 0;
  pcStack_470 = (code *)0x105ff6;
  pVVar2 = (VMEMcache *)vmemcache_new();
  pcStack_470 = (code *)0x106006;
  vmemcache_set_size(pVVar2,0x100000);
  pcStack_470 = (code *)0x106013;
  vmemcache_set_extent_size(pVVar2,0x100);
  pcStack_470 = (code *)0x106020;
  vmemcache_set_eviction_policy(pVVar2,1);
  pcStack_470 = (code *)0x10602b;
  pcVar15 = dir;
  ppuVar16 = (undefined **)pVVar2;
  iVar1 = vmemcache_add();
  uVar8 = (uint)pcVar15;
  if (iVar1 == 0) {
    pcStack_470 = (code *)0x106049;
    vmemcache_callback_on_evict(pVVar2,on_evict_test_memory_leaks_cb,&local_40);
    if (local_40 < 1000) {
      get = (stat_t *)0x0;
      pcVar15 = unaff_R12;
      do {
        pcStack_470 = (code *)0x106064;
        iVar1 = rand();
        dir = (char *)(long)iVar1;
        unaff_RBX = ((ulong)dir / 0xff81) * 0xff81;
        unaff_R13 = (ulong)dir % 0xff81 + 0x80;
        pcStack_470 = (code *)0x10609b;
        unaff_R12 = (char *)malloc(unaff_R13);
        if (unaff_R12 == (char *)0x0) {
LAB_0010622e:
          unaff_R12 = pcVar15;
          pcStack_470 = (code *)0x106233;
          test_memory_leaks_cold_9();
          psVar14 = (stat_t *)dir;
LAB_00106233:
          dir = (char *)psVar14;
          pcStack_470 = (code *)0x106238;
          test_memory_leaks_cold_8();
LAB_00106238:
          pcStack_470 = (code *)0x106243;
          test_memory_leaks_cold_5();
LAB_00106243:
          pcStack_470 = (code *)0x10624f;
          test_memory_leaks_cold_4();
LAB_0010624f:
          pcStack_470 = (code *)0x10625a;
          test_memory_leaks_cold_3();
LAB_0010625a:
          ppuVar16 = (undefined **)&n_evicts;
          uVar8 = (uint)&local_40;
          pcStack_470 = (code *)0x106267;
          test_memory_leaks_cold_2();
          goto LAB_00106267;
        }
        psVar14 = (stat_t *)((ulong)dir % 0xff81);
        pcStack_470 = (code *)0x1060bb;
        memset(unaff_R12,0x2a,(size_t)((long)psVar14 + 0x7f));
        (unaff_R12 + 0x7f)[(long)psVar14] = '\0';
        if (vsize._4_4_ == 0) {
          uVar6 = 8;
          __s = &n_evicts;
        }
        else {
          __s = (stat_t *)&stack0xfffffffffffffba0;
          pcStack_470 = (code *)0x1060e0;
          memset(__s,0x2a,0x400);
          uVar6 = 0x408;
          psVar14 = __s;
        }
        pcStack_470 = (code *)0x10610c;
        iVar1 = vmemcache_put(pVVar2,__s,uVar6,unaff_R12,unaff_R13);
        dir = (char *)psVar14;
        if (iVar1 != 0) goto LAB_0010625a;
        pcStack_470 = (code *)0x10611c;
        dir = (char *)malloc(unaff_R13);
        if ((stat_t *)dir == (stat_t *)0x0) goto LAB_00106233;
        if (vsize._4_4_ == 0) {
          uVar6 = 8;
          psVar14 = &n_evicts;
        }
        else {
          uVar6 = 0x408;
          psVar14 = (stat_t *)&stack0xfffffffffffffba0;
        }
        in_stack_fffffffffffffb98 = &local_50;
        pcStack_470 = (code *)0x106169;
        sVar3 = vmemcache_get(pVVar2,psVar14,uVar6,dir,unaff_R13,0);
        pcVar15 = unaff_R12;
        if ((long)sVar3 < 0) {
          pcStack_470 = (code *)0x10622e;
          test_memory_leaks_cold_7();
          goto LAB_0010622e;
        }
        if (sVar3 != unaff_R13) goto LAB_0010624f;
        if (unaff_R13 != local_50) goto LAB_00106243;
        pcStack_470 = (code *)0x106190;
        iVar1 = strcmp(unaff_R12,dir);
        if (iVar1 != 0) goto LAB_00106238;
        pcStack_470 = (code *)0x1061a0;
        free(unaff_R12);
        pcStack_470 = (code *)0x1061a8;
        free(dir);
        get = (stat_t *)((long)get + 1);
        sVar10 = n_evicts + 1;
        n_evicts = sVar10;
      } while (local_40 < 1000);
    }
    else {
      sVar10 = 0;
      get = (stat_t *)0x0;
    }
    pcStack_470 = (code *)0x1061dc;
    verify_stat_entries(pVVar2,sVar10 - local_40);
    do {
      pcStack_470 = (code *)0x1061e8;
      iVar1 = vmemcache_evict(pVVar2,0,0);
    } while (iVar1 == 0);
    pcStack_470 = (code *)0x106205;
    sVar10 = n_evicts;
    verify_stats(pVVar2,n_evicts,(stat_t)get,(stat_t)get,0,local_40,
                 (stat_t)in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,bk.buf._0_8_);
    uVar8 = (uint)sVar10;
    pcStack_470 = (code *)0x10620d;
    ppuVar16 = (undefined **)pVVar2;
    vmemcache_delete();
    dir = (char *)get;
    if (local_40 == n_evicts) {
      return;
    }
  }
  else {
LAB_00106267:
    pcStack_470 = (code *)0x10626c;
    test_memory_leaks_cold_1();
  }
  pcStack_470 = test_merge_allocations;
  test_memory_leaks_cold_6();
  pcVar15 = (char *)(ulong)uVar8;
  pcStack_498 = (code *)0x106287;
  lStack_490 = unaff_RBX;
  pcStack_488 = unaff_R12;
  psStack_480 = (stat_t *)dir;
  pVStack_478 = pVVar2;
  pcStack_470 = (code *)&stack0xfffffffffffffff8;
  cache = (VMEMcache *)vmemcache_new();
  pcStack_498 = (code *)0x106297;
  vmemcache_set_size(cache,0x100000);
  pcStack_498 = (code *)0x1062a4;
  vmemcache_set_extent_size(cache,0x100);
  pcStack_498 = (code *)0x1062af;
  vmemcache_set_eviction_policy(cache,pcVar15);
  pcStack_498 = (code *)0x1062ba;
  pVVar2 = (VMEMcache *)ppuVar16;
  pVVar7 = cache;
  iVar1 = vmemcache_add();
  uVar9 = SUB84(pVVar2,0);
  if (iVar1 != 0) goto LAB_001063ba;
  unaff_R12 = (char *)0x0;
  sVar10 = 0;
  pcStack_498 = (code *)0x1062cf;
  verify_stat_entries(cache,0);
  pcStack_498 = (code *)0x1062d7;
  verify_heap_entries(cache,sVar10);
  ppuVar16 = &PTR_anon_var_dwarf_5a6_0010ada0;
  pcVar15 = "VALUE";
  do {
    uVar6 = *(undefined8 *)(unaff_R12 + 0x10ada0);
    pcStack_498 = (code *)0x1062ff;
    pVVar7 = cache;
    iVar1 = vmemcache_put(cache,uVar6,6,"VALUE",6);
    uVar9 = (undefined4)uVar6;
    if (iVar1 != 0) {
      pcStack_498 = (code *)0x1063b5;
      test_merge_allocations_cold_2();
      goto LAB_001063b5;
    }
    unaff_R12 = unaff_R12 + 8;
  } while (unaff_R12 != (char *)0x28);
  sVar10 = 5;
  pcStack_498 = (code *)0x10631e;
  verify_stat_entries(cache,5);
  pcStack_498 = (code *)0x106326;
  verify_heap_entries(cache,sVar10);
  pcVar15 = (char *)0x0;
  unaff_R12 = "\x01";
  do {
    puVar11 = (&PTR_anon_var_dwarf_5a6_0010ada0)[*(uint *)((long)&DAT_00107c20 + (long)pcVar15)];
    pcStack_498 = (code *)0x106345;
    pVVar7 = cache;
    iVar1 = vmemcache_evict(cache,puVar11,6);
    uVar9 = SUB84(puVar11,0);
    if (iVar1 == -1) goto LAB_001063b5;
    pcVar15 = pcVar15 + 4;
  } while (pcVar15 != (char *)0x14);
  sVar10 = 0;
  pcStack_498 = (code *)0x10635e;
  verify_stat_entries(cache,0);
  pcStack_498 = (code *)0x106366;
  verify_heap_entries(cache,sVar10);
  uVar9 = 0x1079b7;
  pcStack_498 = (code *)0x106387;
  pVVar7 = cache;
  iVar1 = vmemcache_put(cache,"KEY_1",6,"VALUE",6);
  if (iVar1 == 0) {
    sVar10 = 1;
    pcStack_498 = (code *)0x106398;
    verify_stat_entries(cache,1);
    pcStack_498 = (code *)0x1063a0;
    verify_heap_entries(cache,sVar10);
    vmemcache_delete(cache);
    return;
  }
LAB_001063bf:
  pcStack_498 = test_offsets;
  test_merge_allocations_cold_3();
  pVVar2 = (VMEMcache *)auStack_738;
  apuStack_6c8[0] = auStack_6f8;
  apuStack_6c8[1] = (undefined1 *)0x20;
  alStack_6b8[0] = 0;
  alStack_6b8[1] = 0x20;
  uStack_6a0 = 0x20;
  uStack_698 = 2;
  uStack_690 = 0x1e;
  uStack_680 = 0x20;
  uStack_678 = 0x1f;
  uStack_670 = 1;
  uStack_660 = 0x20;
  uStack_658 = 0x20;
  uStack_650 = 0;
  uStack_640 = 0x20;
  uStack_638 = 0x21;
  uStack_630 = 0;
  puStack_628 = auStack_738;
  uStack_620 = 0x40;
  uStack_618 = 0;
  uStack_610 = 0x20;
  uStack_600 = 0x40;
  uStack_5f8 = 4;
  uStack_5f0 = 0x1c;
  uStack_5e0 = 0x40;
  uStack_5d8 = 0x1f;
  uStack_5d0 = 1;
  uStack_5c0 = 0x40;
  uStack_5b8 = 0x20;
  uStack_5b0 = 0;
  uStack_5a0 = 0x40;
  uStack_598 = 0x21;
  uStack_590 = 0;
  puStack_588 = auStack_6d8;
  uStack_580 = 0x10;
  uStack_578 = 0;
  uStack_570 = 0x10;
  uStack_560 = 0x10;
  uStack_558 = 2;
  uStack_550 = 0x10;
  uStack_540 = 0x10;
  uStack_538 = 0x10;
  uStack_530 = 0x10;
  uStack_520 = 0x10;
  uStack_518 = 0x12;
  uStack_510 = 0xe;
  uStack_500 = 0x10;
  uStack_4f8 = 0x20;
  uStack_4f0 = 0;
  uStack_4e0 = 0x10;
  uStack_4d8 = 0x21;
  uStack_4d0 = 0;
  uStack_740 = 0x1065d6;
  puStack_6a8 = apuStack_6c8[0];
  puStack_688 = apuStack_6c8[0];
  puStack_668 = apuStack_6c8[0];
  puStack_648 = apuStack_6c8[0];
  puStack_608 = puStack_628;
  puStack_5e8 = puStack_628;
  puStack_5c8 = puStack_628;
  puStack_5a8 = puStack_628;
  puStack_568 = puStack_588;
  puStack_548 = puStack_588;
  puStack_528 = puStack_588;
  puStack_508 = puStack_588;
  puStack_4e8 = puStack_588;
  pVStack_4c0 = cache;
  pcStack_4b8 = unaff_R12;
  sStack_4b0 = unaff_R13;
  pcStack_4a8 = pcVar15;
  pVStack_4a0 = (VMEMcache *)ppuVar16;
  pcStack_498 = (code *)&pcStack_470;
  pvVar4 = (void *)vmemcache_new();
  uStack_740 = 0x1065e6;
  vmemcache_set_size(pvVar4,0x100000);
  uStack_740 = 0x1065f3;
  vmemcache_set_extent_size(pvVar4,0x100);
  uStack_740 = 0x1065fe;
  vmemcache_set_eviction_policy(pvVar4,uVar9);
  uStack_740 = 0x106609;
  pvVar12 = pvVar4;
  iVar1 = vmemcache_add(pvVar4,pVVar7);
  if (iVar1 == 0) {
    pVVar2 = (VMEMcache *)&uStack_758;
    uStack_758 = 0x6867666564636261;
    uStack_750 = 0x706f6e6d6c6b6a69;
    uStack_748 = 0x74737271;
    uStack_744 = 0x78777675;
    uStack_740 = 0x7f7e7d7c7b7a79;
    pvVar12 = pvVar4;
    iVar1 = vmemcache_put(pvVar4,"KEY",4,pVVar2,0x20);
    pVVar7 = pVVar2;
    if (iVar1 == 0) {
      lVar13 = 0;
      while (sVar3 = vmemcache_get(pvVar4,"KEY",4,*(undefined8 *)((long)apuStack_6c8 + lVar13),
                                   *(undefined8 *)((long)apuStack_6c8 + lVar13 + 8),
                                   *(undefined8 *)((long)alStack_6b8 + lVar13),&lStack_4c8),
            sVar3 == *(size_t *)((long)alStack_6b8 + lVar13 + 8)) {
        if (lStack_4c8 != 0x20) {
          test_offsets_cold_4();
          break;
        }
        if ((0 < (long)sVar3) &&
           (iVar1 = strncmp(*(char **)((long)apuStack_6c8 + lVar13),
                            (char *)(pVVar2 + *(long *)((long)alStack_6b8 + lVar13)),sVar3),
           iVar1 != 0)) goto LAB_0010670d;
        lVar13 = lVar13 + 0x20;
        if (lVar13 == 0x200) {
          vmemcache_delete(pvVar4);
          return;
        }
      }
      test_offsets_cold_3();
LAB_0010670d:
      pvVar12 = (void *)((long)apuStack_6c8 + lVar13);
      test_offsets_cold_5();
      goto LAB_00106720;
    }
  }
  else {
LAB_00106720:
    *(undefined8 *)(pVVar2 + -8) = 0x106725;
    test_offsets_cold_1();
  }
  *(code **)(pVVar2 + -8) = test_vmemcache_get_stat;
  test_offsets_cold_2();
  *(code ***)(pVVar2 + -8) = &pcStack_498;
  *(VMEMcache **)(pVVar2 + -0x10) = pVVar7;
  pVVar7 = pVVar2 + -0x18;
  *(void **)(pVVar2 + -0x18) = pvVar4;
  *(undefined8 *)(pVVar2 + -0x20) = 0x106739;
  uVar6 = vmemcache_new();
  *(undefined8 *)(pVVar2 + -0x20) = 0x106749;
  vmemcache_set_size(uVar6,0x100000);
  *(undefined8 *)(pVVar2 + -0x20) = 0x106756;
  vmemcache_set_extent_size(uVar6,0x100);
  *(undefined8 *)(pVVar2 + -0x20) = 0x106761;
  pvVar4 = pvVar12;
  iVar1 = vmemcache_add(uVar6);
  if (iVar1 == 0) {
    pVVar7 = pVVar2 + -0x28;
    pvVar4 = (void *)0x0;
    *(undefined8 *)(pVVar2 + -0x30) = 0x10677c;
    iVar1 = vmemcache_get_stat(uVar6,0,pVVar7,9);
    if (iVar1 != 0) {
      *(undefined8 *)(pVVar2 + -0x30) = 0x106785;
      piVar5 = __errno_location();
      if (*piVar5 == 0x16) {
        *(undefined8 *)(pVVar2 + -0x30) = 0x106792;
        vmemcache_delete(uVar6);
        return;
      }
      goto LAB_001067a5;
    }
  }
  else {
    *(undefined8 *)(pVVar2 + -0x20) = 0x1067a0;
    test_vmemcache_get_stat_cold_1();
  }
  *(undefined8 *)(pVVar7 + -8) = 0x1067a5;
  test_vmemcache_get_stat_cold_3();
LAB_001067a5:
  *(code **)(pVVar7 + -8) = verify_stat_entries;
  test_vmemcache_get_stat_cold_2();
  *(VMEMcache **)(pVVar7 + -8) = pVVar2 + -8;
  *(undefined8 *)(pVVar7 + -0x10) = uVar6;
  *(undefined8 *)(pVVar7 + -0x18) = extraout_RAX;
  __dest = (void *)0x8;
  *(undefined8 *)(pVVar7 + -0x20) = 0x1067c9;
  iVar1 = vmemcache_get_stat();
  if (iVar1 == -1) {
    *(undefined8 *)(pVVar7 + -0x20) = 0x1067e0;
    verify_stat_entries_cold_2();
  }
  else if (*(void **)(pVVar7 + -0x18) == pvVar4) {
    return;
  }
  *(code **)(pVVar7 + -0x20) = on_evict_test_evict_cb;
  __src = pvVar4;
  verify_stat_entries_cold_1();
  *(VMEMcache **)(pVVar7 + -0x20) = pVVar7 + -8;
  *(long *)((long)__dest + 0x118) = *(long *)((long)__dest + 0x118) + 1;
  *(long *)(pVVar7 + -0x30) = (long)__dest + 0x108;
  *(undefined8 *)(pVVar7 + -0x38) = 0x106815;
  lVar13 = vmemcache_get();
  if (lVar13 < 0) {
    *(undefined8 *)(pVVar7 + -0x38) = 0x10682d;
    on_evict_test_evict_cb_cold_2();
  }
  else if (lVar13 == 0x100) {
    return;
  }
  *(code **)(pVVar7 + -0x38) = on_miss_test_evict_cb;
  on_evict_test_evict_cb_cold_1();
  *(VMEMcache **)(pVVar7 + -0x38) = pVVar7 + -0x20;
  *(void **)(pVVar7 + -0x40) = pvVar12;
  *(void **)(pVVar7 + -0x48) = pvVar4;
  *(long *)((long)__dest + 0x110) = *(long *)((long)__dest + 0x110) + 1;
  __n = extraout_RDX;
  if (*(ulong *)((long)__dest + 0x100) < extraout_RDX) {
    __n = *(ulong *)((long)__dest + 0x100);
  }
  *(undefined8 *)(pVVar7 + -0x50) = 0x106862;
  memcpy(__dest,__src,__n);
  *(ulong *)((long)__dest + 0x108) = __n;
  return;
LAB_001063b5:
  pcStack_498 = (code *)0x1063ba;
  test_merge_allocations_cold_4();
LAB_001063ba:
  pcStack_498 = (code *)0x1063bf;
  test_merge_allocations_cold_1();
  goto LAB_001063bf;
}

Assistant:

static void
test_memory_leaks(const char *dir, int key_gt_1K,
			enum vmemcache_repl_p repl_p,
			unsigned seed)
{
	char *vbuf;
	char *get_buf;
	size_t size;
	size_t vsize;
	int ret;
	ssize_t get_ret;
	struct big_key bk;

	srand(seed);

	stat_t n_puts = 0;
	stat_t n_evicts = 0;
	stat_t n_gets = 0;

	size_t min_size = VMEMCACHE_MIN_EXTENT / 2;
	size_t max_size = VMEMCACHE_MIN_POOL / 16;

	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_callback_on_evict(cache, on_evict_test_memory_leaks_cb,
					&n_evicts);

	while (n_evicts < 1000) {
		size = min_size + (size_t)rand() % (max_size - min_size + 1);

		vbuf = malloc(size);
		if (vbuf == NULL)
			UT_FATAL("out of memory");
		memset(vbuf, 42, size - 1);
		vbuf[size - 1] = '\0';

		if (key_gt_1K) {
			memset(bk.buf, 42 /* arbitrary */, sizeof(bk.buf));
			bk.n_puts = n_puts;

			ret = vmemcache_put(cache, &bk, sizeof(bk), vbuf, size);
		} else {
			ret = vmemcache_put(cache, &n_puts, sizeof(n_puts),
						vbuf, size);
		}

		if (ret)
			UT_FATAL(
				"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",
				n_puts, n_evicts, vmemcache_errormsg());

		get_buf = malloc(size);
		if (get_buf == NULL)
			UT_FATAL("out of memory");
		if (key_gt_1K)
			get_ret = vmemcache_get(cache, &bk, sizeof(bk), get_buf,
							size, 0, &vsize);
		else
			get_ret = vmemcache_get(cache, &n_puts, sizeof(n_puts),
							get_buf, size, 0,
							&vsize);
		if (get_ret < 0)
			UT_FATAL("vmemcache_get: %s", vmemcache_errormsg());

		if ((size_t)get_ret != size)
			UT_FATAL(
				"vmemcache_get: wrong return value: %zi (should be %zu)",
				get_ret, size);

		if (size != vsize)
			UT_FATAL(
				"vmemcache_get: wrong size of value: %zi (should be %zu)",
				vsize, size);

		if (strcmp(vbuf, get_buf))
			UT_FATAL(
				"vmemcache_get: wrong value: %s (should be %s)",
				get_buf, vbuf);

		free(vbuf);
		free(get_buf);

		n_gets++;
		n_puts++;
	}

	verify_stat_entries(cache, n_puts - n_evicts);

	/* free all the memory */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

	/* check statistics */
	verify_stats(cache, n_puts, n_gets, n_gets, 0, n_evicts, 0, 0, 0);

	vmemcache_delete(cache);

	if (n_evicts != n_puts)
		UT_FATAL("memory leak detected");
}